

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

quad<unsigned_char> __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
           *this,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  context = &this->context_run_mode_;
  iVar1 = decode_run_interruption_error(this,context->_M_elems);
  iVar2 = decode_run_interruption_error(this,context->_M_elems);
  iVar3 = decode_run_interruption_error(this,context->_M_elems);
  iVar4 = decode_run_interruption_error(this,context->_M_elems);
  iVar5 = -iVar1;
  if (((uint)ra & 0xff) <= ((uint)rb & 0xff)) {
    iVar5 = iVar1;
  }
  iVar7 = -iVar2;
  if (((uint)ra >> 8 & 0xff) <= ((uint)rb >> 8 & 0xff)) {
    iVar7 = iVar2;
  }
  iVar6 = -iVar3;
  if (((uint)ra >> 0x10 & 0xff) <= ((uint)rb >> 0x10 & 0xff)) {
    iVar6 = iVar3;
  }
  if ((uint)rb >> 0x18 < (uint)ra >> 0x18) {
    iVar4 = -iVar4;
  }
  return (quad<unsigned_char>)
         ((iVar4 + ((uint)rb >> 0x18)) * 0x1000000 |
         (iVar6 + ((uint)rb >> 0x10) & 0xff) << 0x10 |
         iVar5 + (int)rb & 0xffU | (iVar7 + ((uint)rb >> 8) & 0xff) << 8);
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }